

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_api.c
# Opt level: O2

void * ecs_os_api_realloc(void *ptr,ecs_size_t size)

{
  void *pvVar1;
  int64_t *piVar2;
  
  _ecs_assert(0 < size,2,(char *)0x0,"size > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/os_api.c"
              ,0x8a);
  if (0 < size) {
    piVar2 = &ecs_os_api_realloc_count;
    if (ptr == (void *)0x0) {
      piVar2 = &ecs_os_api_malloc_count;
    }
    *piVar2 = *piVar2 + 1;
    pvVar1 = realloc(ptr,(ulong)(uint)size);
    return pvVar1;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/os_api.c"
                ,0x8a,"void *ecs_os_api_realloc(void *, ecs_size_t)");
}

Assistant:

static
void* ecs_os_api_realloc(void *ptr, ecs_size_t size) {
    ecs_assert(size > 0, ECS_INVALID_PARAMETER, NULL);

    if (ptr) {
        ecs_os_api_realloc_count ++;
    } else {
        /* If not actually reallocing, treat as malloc */
        ecs_os_api_malloc_count ++; 
    }
    
    return realloc(ptr, (size_t)size);
}